

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O0

inputs_t allocateInputs(picnic_instance_t *params)

{
  inputs_t ppuVar1;
  long in_RDI;
  uint32_t i;
  inputs_t inputs;
  uint8_t *slab;
  uint local_1c;
  inputs_t local_10;
  
  ppuVar1 = (inputs_t)calloc(1,(ulong)*(ushort *)(in_RDI + 4) * ((ulong)*(byte *)(in_RDI + 8) + 8));
  local_10 = ppuVar1 + *(ushort *)(in_RDI + 4);
  for (local_1c = 0; local_1c < *(ushort *)(in_RDI + 4); local_1c = local_1c + 1) {
    ppuVar1[local_1c] = (uint8_t *)local_10;
    local_10 = (inputs_t)((long)local_10 + (long)(int)(uint)*(byte *)(in_RDI + 8));
  }
  return ppuVar1;
}

Assistant:

inputs_t allocateInputs(const picnic_instance_t* params) {
  uint8_t* slab = calloc(1, params->num_rounds * (params->input_output_size + sizeof(uint8_t*)));

  inputs_t inputs = (uint8_t**)slab;

  slab += params->num_rounds * sizeof(uint8_t*);

  for (uint32_t i = 0; i < params->num_rounds; i++) {
    inputs[i] = (uint8_t*)slab;
    slab += params->input_output_size;
  }

  return inputs;
}